

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall CaDiCaL::Solver::reset_observed_vars(Solver *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  File *file;
  char *__s;
  char *__s_00;
  char *__s_01;
  undefined8 in_RCX;
  Solver *pSVar18;
  CaDiCaL *file_name;
  Internal *pIVar19;
  bool antecedents;
  bool antecedents_00;
  bool antecedents_01;
  bool antecedents_02;
  Internal *this_00;
  Solver *this_01;
  Solver *this_02;
  CaDiCaL *this_03;
  undefined1 print;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  External *pEVar23;
  External *pEVar24;
  Internal *pIVar25;
  undefined1 *this_04;
  bool bVar26;
  bool bVar27;
  
  bVar26 = this->internal == (Internal *)0x0;
  pFVar4 = (FILE *)this->trace_api_file;
  pcVar21 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    fprintf(pFVar4,"%s\n","reset_observed_vars");
    fflush((FILE *)this->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::reset_observed_vars()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  pEVar23 = this->external;
  if (pEVar23 == (External *)0x0) {
    reset_observed_vars();
LAB_0085f1df:
    reset_observed_vars();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0085f1df;
    if ((this->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::reset_observed_vars(pEVar23);
      return;
    }
  }
  reset_observed_vars();
  bVar26 = *(long *)&pEVar23->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar23->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar21 = (char *)CONCAT71((int7)((ulong)pcVar21 >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    fprintf(pFVar4,"%s\n","active");
    fflush(*(FILE **)&(pEVar23->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar24 = pEVar23;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar23,"int CaDiCaL::Solver::active() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  if (pEVar23->vsize == 0) {
    active();
LAB_0085f25b:
    active();
  }
  else {
    if (*(long *)&pEVar23->max_var == 0) goto LAB_0085f25b;
    if (((ulong)pEVar23->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  active();
  bVar26 = *(long *)&pEVar24->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar24->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar21 = (char *)CONCAT71((int7)((ulong)pcVar21 >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    fprintf(pFVar4,"%s\n","redundant");
    fflush(*(FILE **)&(pEVar24->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar23 = pEVar24;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar24,"int64_t CaDiCaL::Solver::redundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  if (pEVar24->vsize == 0) {
    redundant();
LAB_0085f2d8:
    redundant();
  }
  else {
    if (*(long *)&pEVar24->max_var == 0) goto LAB_0085f2d8;
    if (((ulong)pEVar24->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  redundant();
  bVar26 = *(long *)&pEVar23->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar23->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar21 = (char *)CONCAT71((int7)((ulong)pcVar21 >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    fprintf(pFVar4,"%s\n","irredundant");
    fflush(*(FILE **)&(pEVar23->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar20 = "int64_t CaDiCaL::Solver::irredundant() const";
  pEVar24 = pEVar23;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar23,"int64_t CaDiCaL::Solver::irredundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  if (pEVar23->vsize == 0) {
    irredundant();
LAB_0085f354:
    irredundant();
  }
  else {
    if (*(long *)&pEVar23->max_var == 0) goto LAB_0085f354;
    if (((ulong)pEVar23->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  irredundant();
  this_01 = (Solver *)((ulong)pcVar20 & 0xffffffff);
  bVar26 = *(long *)&pEVar24->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar24->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar18 = (Solver *)CONCAT71((int7)((ulong)pcVar21 >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    pSVar18 = this_01;
    fprintf(pFVar4,"%s %d\n","freeze");
    fflush(*(FILE **)&(pEVar24->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar21 = "void CaDiCaL::Solver::freeze(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar24,"void CaDiCaL::Solver::freeze(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar18->adding_clause);
  if ((External *)pEVar24->vsize == (External *)0x0) {
    freeze();
LAB_0085f3e5:
    freeze();
LAB_0085f3ea:
    freeze();
  }
  else {
    if (*(long *)&pEVar24->max_var == 0) goto LAB_0085f3e5;
    if (((ulong)pEVar24->internal & 0x6e00000000) == 0) goto LAB_0085f3ea;
    if (((ulong)pcVar20 & 0x7fffffff) != 0) {
      External::freeze((External *)pEVar24->vsize,(int)pcVar20);
      return;
    }
  }
  freeze(this_01);
  this_02 = (Solver *)((ulong)pcVar21 & 0xffffffff);
  bVar26 = this_01->internal == (Internal *)0x0;
  pFVar4 = (FILE *)this_01->trace_api_file;
  pSVar18 = (Solver *)CONCAT71((int7)((ulong)pSVar18 >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    pSVar18 = this_02;
    fprintf(pFVar4,"%s %d\n","melt");
    fflush((FILE *)this_01->trace_api_file);
  }
  pcVar20 = "void CaDiCaL::Solver::melt(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_01,"void CaDiCaL::Solver::melt(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar18->adding_clause);
  pEVar23 = this_01->external;
  if (pEVar23 == (External *)0x0) {
LAB_0085f4ac:
    melt();
LAB_0085f4b1:
    melt();
LAB_0085f4b6:
    melt();
  }
  else {
    if (this_01->internal == (Internal *)0x0) goto LAB_0085f4b1;
    if ((this_01->_state & VALID) == 0) goto LAB_0085f4b6;
    if (((ulong)pcVar21 & 0x7fffffff) != 0) {
      uVar16 = (uint)pcVar21;
      uVar17 = -uVar16;
      if (0 < (int)uVar16) {
        uVar17 = uVar16;
      }
      if ((((int)uVar17 <= pEVar23->max_var) &&
          (pSVar18 = (Solver *)
                     (pEVar23->frozentab).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
          (int)uVar17 <
          (int)((ulong)((long)(pEVar23->frozentab).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar18) >> 2))) &&
         (*(int *)(&pSVar18->adding_clause + (ulong)uVar17 * 4) != 0)) {
        External::melt(pEVar23,uVar16);
        return;
      }
      melt(this_02);
      goto LAB_0085f4ac;
    }
  }
  melt(this_02);
  this_03 = (CaDiCaL *)((ulong)pcVar20 & 0xffffffff);
  bVar26 = this_02->internal == (Internal *)0x0;
  pFVar4 = (FILE *)this_02->trace_api_file;
  file_name = (CaDiCaL *)CONCAT71((int7)((ulong)pSVar18 >> 8),pFVar4 == (FILE *)0x0 || bVar26);
  if (pFVar4 != (FILE *)0x0 && !bVar26) {
    file_name = this_03;
    fprintf(pFVar4,"%s %d\n","frozen");
    fflush((FILE *)this_02->trace_api_file);
  }
  pcVar21 = "bool CaDiCaL::Solver::frozen(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_02,"bool CaDiCaL::Solver::frozen(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)file_name);
  if (this_02->external == (External *)0x0) {
    frozen();
LAB_0085f575:
    frozen();
LAB_0085f57a:
    frozen();
  }
  else {
    if (this_02->internal == (Internal *)0x0) goto LAB_0085f575;
    if ((this_02->_state & VALID) == 0) goto LAB_0085f57a;
    if (((ulong)pcVar20 & 0x7fffffff) != 0) {
      return;
    }
  }
  frozen();
  pFVar4 = *(FILE **)(this_03 + 0x20);
  pIVar19 = (Internal *)
            CONCAT71((int7)((ulong)file_name >> 8),
                     pFVar4 == (FILE *)0x0 || *(long *)(this_03 + 8) == 0);
  if (pFVar4 != (FILE *)0x0 && *(long *)(this_03 + 8) != 0) {
    pIVar19 = this_00;
    fprintf(pFVar4,"%s %s\n","trace_proof");
    fflush(*(FILE **)(this_03 + 0x20));
  }
  print = 0x10;
  require_solver_pointer_to_be_non_zero
            (this_03,"bool CaDiCaL::Solver::trace_proof(FILE *, const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pIVar19);
  if (*(long *)(this_03 + 0x10) == 0) {
    trace_proof();
LAB_0085f622:
    trace_proof();
LAB_0085f627:
    trace_proof();
  }
  else {
    if (*(long *)(this_03 + 8) == 0) goto LAB_0085f622;
    if ((*(uint *)(this_03 + 4) & 0x6e) == 0) goto LAB_0085f627;
    if (*(uint *)(this_03 + 4) == 2) {
      file = (File *)File::write((int)*(long *)(this_03 + 8),pcVar21,(size_t)this_00);
      Internal::trace(*(Internal **)(this_03 + 8),file);
      return;
    }
  }
  pIVar25 = this_00;
  trace_proof((Solver *)this_00);
  lVar6._0_1_ = pIVar25->preprocessing;
  lVar6._1_1_ = pIVar25->protected_reasons;
  lVar6._2_1_ = pIVar25->force_saved_phase;
  lVar6._3_1_ = pIVar25->searching_lucky_phases;
  lVar6._4_1_ = pIVar25->stable;
  lVar6._5_1_ = pIVar25->reported;
  lVar6._6_1_ = pIVar25->external_prop;
  lVar6._7_1_ = pIVar25->did_external_prop;
  pFVar4 = (FILE *)(pIVar25->reluctant).v;
  pcVar21 = (char *)CONCAT71((int7)((ulong)pIVar19 >> 8),pFVar4 == (FILE *)0x0 || lVar6 == 0);
  if (pFVar4 != (FILE *)0x0 && lVar6 != 0) {
    fprintf(pFVar4,"%s\n","close_proof_trace");
    fflush((FILE *)(pIVar25->reluctant).v);
  }
  pcVar20 = "void CaDiCaL::Solver::close_proof_trace(bool)";
  pIVar19 = pIVar25;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar25,"void CaDiCaL::Solver::close_proof_trace(bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar5._0_1_ = pIVar25->external_prop_is_lazy;
  lVar5._1_1_ = pIVar25->forced_backt_allowed;
  lVar5._2_1_ = pIVar25->private_steps;
  lVar5._3_1_ = pIVar25->rephased;
  lVar5._4_4_ = *(undefined4 *)&pIVar25->field_0x14;
  if (lVar5 == 0) {
    close_proof_trace();
LAB_0085f6d7:
    close_proof_trace();
LAB_0085f6dc:
    close_proof_trace();
LAB_0085f6e1:
    close_proof_trace();
  }
  else {
    lVar6 = *(long *)&pIVar25->preprocessing;
    if (lVar6 == 0) goto LAB_0085f6d7;
    if ((pIVar25->unsat & 0x6eU) == 0) goto LAB_0085f6dc;
    pcVar21 = *(char **)(lVar6 + 0xc50);
    if (*(char **)(lVar6 + 0xc48) == pcVar21) goto LAB_0085f6e1;
    pIVar19 = *(Internal **)(pcVar21 + -8);
    cVar15 = (**(code **)(*(long *)pIVar19 + 0x98))();
    if (cVar15 == '\0') {
      Internal::close_trace(*(Internal **)&pIVar25->preprocessing,(bool)print);
      return;
    }
  }
  close_proof_trace();
  bVar26 = SUB81(pcVar21,0);
  pcVar22 = "void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)";
  pIVar25 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar7._0_1_ = pIVar19->external_prop_is_lazy;
  lVar7._1_1_ = pIVar19->forced_backt_allowed;
  lVar7._2_1_ = pIVar19->private_steps;
  lVar7._3_1_ = pIVar19->rephased;
  lVar7._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar7 == 0) {
    connect_proof_tracer();
LAB_0085f752:
    connect_proof_tracer();
LAB_0085f757:
    connect_proof_tracer();
LAB_0085f75c:
    connect_proof_tracer();
  }
  else {
    pIVar25 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar25 == (Internal *)0x0) goto LAB_0085f752;
    uVar17._0_1_ = pIVar19->unsat;
    uVar17._1_1_ = pIVar19->iterating;
    uVar17._2_1_ = pIVar19->localsearching;
    uVar17._3_1_ = pIVar19->lookingahead;
    if ((uVar17 & 0x6e) == 0) goto LAB_0085f757;
    if (uVar17 != 2) goto LAB_0085f75c;
    if ((Tracer *)pcVar20 != (Tracer *)0x0) {
      Internal::connect_proof_tracer(pIVar25,(Tracer *)pcVar20,antecedents,bVar26);
      return;
    }
  }
  connect_proof_tracer();
  bVar26 = SUB81(pcVar21,0);
  pcVar20 = "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)";
  pIVar19 = pIVar25;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar25,
             "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar8._0_1_ = pIVar25->external_prop_is_lazy;
  lVar8._1_1_ = pIVar25->forced_backt_allowed;
  lVar8._2_1_ = pIVar25->private_steps;
  lVar8._3_1_ = pIVar25->rephased;
  lVar8._4_4_ = *(undefined4 *)&pIVar25->field_0x14;
  if (lVar8 == 0) {
    connect_proof_tracer();
LAB_0085f7cc:
    connect_proof_tracer();
LAB_0085f7d1:
    connect_proof_tracer();
LAB_0085f7d6:
    connect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar25->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0085f7cc;
    uVar16._0_1_ = pIVar25->unsat;
    uVar16._1_1_ = pIVar25->iterating;
    uVar16._2_1_ = pIVar25->localsearching;
    uVar16._3_1_ = pIVar25->lookingahead;
    if ((uVar16 & 0x6e) == 0) goto LAB_0085f7d1;
    if (uVar16 != 2) goto LAB_0085f7d6;
    if ((InternalTracer *)pcVar22 != (InternalTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar19,(InternalTracer *)pcVar22,antecedents_00,bVar26);
      return;
    }
  }
  connect_proof_tracer();
  bVar26 = SUB81(pcVar21,0);
  pcVar22 = "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)";
  pIVar25 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,
             "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar9._0_1_ = pIVar19->external_prop_is_lazy;
  lVar9._1_1_ = pIVar19->forced_backt_allowed;
  lVar9._2_1_ = pIVar19->private_steps;
  lVar9._3_1_ = pIVar19->rephased;
  lVar9._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar9 == 0) {
    connect_proof_tracer();
LAB_0085f846:
    connect_proof_tracer();
LAB_0085f84b:
    connect_proof_tracer();
LAB_0085f850:
    connect_proof_tracer();
  }
  else {
    pIVar25 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar25 == (Internal *)0x0) goto LAB_0085f846;
    uVar1._0_1_ = pIVar19->unsat;
    uVar1._1_1_ = pIVar19->iterating;
    uVar1._2_1_ = pIVar19->localsearching;
    uVar1._3_1_ = pIVar19->lookingahead;
    if ((uVar1 & 0x6e) == 0) goto LAB_0085f84b;
    if (uVar1 != 2) goto LAB_0085f850;
    if ((StatTracer *)pcVar20 != (StatTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar25,(StatTracer *)pcVar20,antecedents_01,bVar26);
      return;
    }
  }
  connect_proof_tracer();
  bVar26 = SUB81(pcVar21,0);
  pcVar20 = "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)";
  pIVar19 = pIVar25;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar25,
             "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar10._0_1_ = pIVar25->external_prop_is_lazy;
  lVar10._1_1_ = pIVar25->forced_backt_allowed;
  lVar10._2_1_ = pIVar25->private_steps;
  lVar10._3_1_ = pIVar25->rephased;
  lVar10._4_4_ = *(undefined4 *)&pIVar25->field_0x14;
  if (lVar10 == 0) {
    connect_proof_tracer();
LAB_0085f8c0:
    connect_proof_tracer();
LAB_0085f8c5:
    connect_proof_tracer();
LAB_0085f8ca:
    connect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar25->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0085f8c0;
    uVar2._0_1_ = pIVar25->unsat;
    uVar2._1_1_ = pIVar25->iterating;
    uVar2._2_1_ = pIVar25->localsearching;
    uVar2._3_1_ = pIVar25->lookingahead;
    if ((uVar2 & 0x6e) == 0) goto LAB_0085f8c5;
    if (uVar2 != 2) goto LAB_0085f8ca;
    if ((FileTracer *)pcVar22 != (FileTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar19,(FileTracer *)pcVar22,antecedents_02,bVar26);
      return;
    }
  }
  connect_proof_tracer();
  pcVar22 = "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)";
  pIVar25 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar11._0_1_ = pIVar19->external_prop_is_lazy;
  lVar11._1_1_ = pIVar19->forced_backt_allowed;
  lVar11._2_1_ = pIVar19->private_steps;
  lVar11._3_1_ = pIVar19->rephased;
  lVar11._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar11 == 0) {
    disconnect_proof_tracer();
LAB_0085f921:
    disconnect_proof_tracer();
LAB_0085f926:
    disconnect_proof_tracer();
  }
  else {
    pIVar25 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar25 == (Internal *)0x0) goto LAB_0085f921;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0085f926;
    if ((Tracer *)pcVar20 != (Tracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar25,(Tracer *)pcVar20);
      return;
    }
  }
  disconnect_proof_tracer();
  pcVar20 = "bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)";
  pIVar19 = pIVar25;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar25,"bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar12._0_1_ = pIVar25->external_prop_is_lazy;
  lVar12._1_1_ = pIVar25->forced_backt_allowed;
  lVar12._2_1_ = pIVar25->private_steps;
  lVar12._3_1_ = pIVar25->rephased;
  lVar12._4_4_ = *(undefined4 *)&pIVar25->field_0x14;
  if (lVar12 == 0) {
    disconnect_proof_tracer();
LAB_0085f97d:
    disconnect_proof_tracer();
LAB_0085f982:
    disconnect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar25->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0085f97d;
    if ((pIVar25->unsat & 0x6eU) == 0) goto LAB_0085f982;
    if ((StatTracer *)pcVar22 != (StatTracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar19,(StatTracer *)pcVar22);
      return;
    }
  }
  disconnect_proof_tracer();
  pIVar25 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"bool CaDiCaL::Solver::disconnect_proof_tracer(FileTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  lVar13._0_1_ = pIVar19->external_prop_is_lazy;
  lVar13._1_1_ = pIVar19->forced_backt_allowed;
  lVar13._2_1_ = pIVar19->private_steps;
  lVar13._3_1_ = pIVar19->rephased;
  lVar13._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar13 == 0) {
    disconnect_proof_tracer();
LAB_0085f9d9:
    disconnect_proof_tracer();
LAB_0085f9de:
    disconnect_proof_tracer();
  }
  else {
    pIVar25 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar25 == (Internal *)0x0) goto LAB_0085f9d9;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0085f9de;
    if ((FileTracer *)pcVar20 != (FileTracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar25,(FileTracer *)pcVar20);
      return;
    }
  }
  disconnect_proof_tracer();
  lVar14._0_1_ = pIVar25->preprocessing;
  lVar14._1_1_ = pIVar25->protected_reasons;
  lVar14._2_1_ = pIVar25->force_saved_phase;
  lVar14._3_1_ = pIVar25->searching_lucky_phases;
  lVar14._4_1_ = pIVar25->stable;
  lVar14._5_1_ = pIVar25->reported;
  lVar14._6_1_ = pIVar25->external_prop;
  lVar14._7_1_ = pIVar25->did_external_prop;
  pFVar4 = (FILE *)(pIVar25->reluctant).v;
  pcVar21 = (char *)CONCAT71((int7)((ulong)pcVar21 >> 8),pFVar4 == (FILE *)0x0 || lVar14 == 0);
  if (pFVar4 != (FILE *)0x0 && lVar14 != 0) {
    fprintf(pFVar4,"%s\n","conclude");
    fflush((FILE *)(pIVar25->reluctant).v);
  }
  pcVar20 = "void CaDiCaL::Solver::conclude()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar25,"void CaDiCaL::Solver::conclude()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar21);
  pEVar23 = *(External **)&pIVar25->external_prop_is_lazy;
  if (pEVar23 == (External *)0x0) {
    conclude();
LAB_0085fa79:
    conclude();
  }
  else {
    if (*(Internal **)&pIVar25->preprocessing == (Internal *)0x0) goto LAB_0085fa79;
    uVar3._0_1_ = pIVar25->unsat;
    uVar3._1_1_ = pIVar25->iterating;
    uVar3._2_1_ = pIVar25->localsearching;
    uVar3._3_1_ = pIVar25->lookingahead;
    if ((uVar3 & 0x6e) != 0) {
      if (uVar3 == 4) {
        External::conclude_unknown(pEVar23);
        return;
      }
      if (uVar3 == 0x20) {
        External::conclude_sat(pEVar23);
        return;
      }
      if (uVar3 == 0x40) {
        Internal::conclude_unsat(*(Internal **)&pIVar25->preprocessing);
        return;
      }
      goto LAB_0085fa83;
    }
  }
  conclude();
LAB_0085fa83:
  conclude();
  bVar26 = _stderr != pEVar23;
  if (bVar26) {
    this_04 = (undefined1 *)0x0;
  }
  else {
    this_04 = terr;
  }
  bVar27 = _stdout == pEVar23;
  if (bVar27) {
    this_04 = tout;
  }
  pcVar21 = CaDiCaL::version();
  pcVar22 = identifier();
  __s = compiler();
  __s_00 = date();
  __s_01 = flags();
  fputs(pcVar20,(FILE *)pEVar23);
  if (bVar27 || !bVar26) {
    Terminal::color((Terminal *)this_04,0x23,false);
    fputs("Version ",(FILE *)pEVar23);
    Terminal::code((Terminal *)this_04,"0m");
  }
  else {
    fputs("Version ",(FILE *)pEVar23);
  }
  fputs(pcVar21,(FILE *)pEVar23);
  if (pcVar22 != (char *)0x0) {
    if (bVar27 || !bVar26) {
      Terminal::color((Terminal *)this_04,0x23,false);
      fputc(0x20,(FILE *)pEVar23);
      fputs(pcVar22,(FILE *)pEVar23);
      Terminal::code((Terminal *)this_04,"0m");
    }
    else {
      fputc(0x20,(FILE *)pEVar23);
      fputs(pcVar22,(FILE *)pEVar23);
    }
  }
  fputc(10,(FILE *)pEVar23);
  if (__s != (char *)0x0) {
    fputs(pcVar20,(FILE *)pEVar23);
    if (bVar27 || !bVar26) {
      Terminal::color((Terminal *)this_04,0x23,false);
    }
    fputs(__s,(FILE *)pEVar23);
    if (__s_01 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar23);
      fputs(__s_01,(FILE *)pEVar23);
    }
    if (bVar27 || !bVar26) {
      Terminal::code((Terminal *)this_04,"0m");
    }
    fputc(10,(FILE *)pEVar23);
  }
  if (__s_00 != (char *)0x0) {
    fputs(pcVar20,(FILE *)pEVar23);
    if (bVar27 || !bVar26) {
      Terminal::color((Terminal *)this_04,0x23,false);
      fputs(__s_00,(FILE *)pEVar23);
      Terminal::code((Terminal *)this_04,"0m");
    }
    else {
      fputs(__s_00,(FILE *)pEVar23);
    }
    fputc(10,(FILE *)pEVar23);
  }
  fflush((FILE *)pEVar23);
  return;
}

Assistant:

void Solver::reset_observed_vars () {
  TRACE ("reset_observed_vars");
  REQUIRE_VALID_OR_SOLVING_STATE ();
  external->reset_observed_vars ();
  LOG_API_CALL_END ("reset_observed_vars");
}